

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

void crnlib::RcTree_ReverseEncode(CRangeEnc *rc,UInt16 *probs,int numBitLevels,UInt32 symbol)

{
  int local_28;
  UInt32 bit;
  int i;
  UInt32 m;
  UInt32 symbol_local;
  int numBitLevels_local;
  UInt16 *probs_local;
  CRangeEnc *rc_local;
  
  bit = 1;
  i = symbol;
  for (local_28 = 0; local_28 < numBitLevels; local_28 = local_28 + 1) {
    RangeEnc_EncodeBit(rc,probs + bit,i & 1U);
    bit = bit << 1 | i & 1U;
    i = (uint)i >> 1;
  }
  return;
}

Assistant:

static void RcTree_ReverseEncode(CRangeEnc* rc, CLzmaProb* probs, int numBitLevels, UInt32 symbol) {
  UInt32 m = 1;
  int i;
  for (i = 0; i < numBitLevels; i++) {
    UInt32 bit = symbol & 1;
    RangeEnc_EncodeBit(rc, probs + m, bit);
    m = (m << 1) | bit;
    symbol >>= 1;
  }
}